

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingTypeError_Test::
~DescriptorDatabaseTest_ConflictingTypeError_Test
          (DescriptorDatabaseTest_ConflictingTypeError_Test *this)

{
  DescriptorDatabaseTest_ConflictingTypeError_Test *this_local;
  
  ~DescriptorDatabaseTest_ConflictingTypeError_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingTypeError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"bar.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
}